

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_box_set.cpp
# Opt level: O1

void __thiscall
GIM_BOX_TREE::build_tree(GIM_BOX_TREE *this,gim_array<GIM_AABB_DATA> *primitive_boxes)

{
  undefined8 *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  
  *(undefined4 *)this = 0;
  uVar3 = *(int *)(primitive_boxes + 8) * 2;
  uVar4 = *(uint *)(this + 0x10);
  if (uVar4 < uVar3) {
    if (*(uint *)(this + 0x14) < uVar3) {
      if ((ulong)uVar4 == 0) {
        pvVar5 = gim_alloc((ulong)uVar3 * 0x30);
      }
      else {
        pvVar5 = gim_realloc(*(void **)(this + 8),(ulong)uVar4 * 0x30,(ulong)uVar3 * 0x30);
      }
      *(void **)(this + 8) = pvVar5;
      *(uint *)(this + 0x14) = uVar3;
    }
    uVar4 = *(uint *)(this + 0x10);
    while (uVar4 < uVar3) {
      lVar2 = *(long *)(this + 8);
      puVar1 = (undefined8 *)(lVar2 + 0x10 + (ulong)uVar4 * 0x30);
      *puVar1 = uStack_38;
      puVar1[1] = uStack_30;
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1 = (undefined8 *)(lVar2 + (ulong)uVar4 * 0x30);
      *puVar1 = local_48;
      puVar1[1] = uStack_40;
      puVar1[2] = uStack_38;
      puVar1[3] = uStack_30;
      uVar4 = *(int *)(this + 0x10) + 1;
      *(uint *)(this + 0x10) = uVar4;
    }
  }
  else if (uVar3 < uVar4) {
    *(uint *)(this + 0x10) = uVar3;
  }
  _build_sub_tree(this,primitive_boxes,0,*(uint *)(primitive_boxes + 8));
  return;
}

Assistant:

void GIM_BOX_TREE::build_tree(
	gim_array<GIM_AABB_DATA>& primitive_boxes)
{
	// initialize node count to 0
	m_num_nodes = 0;
	// allocate nodes
	m_node_array.resize(primitive_boxes.size() * 2);

	_build_sub_tree(primitive_boxes, 0, primitive_boxes.size());
}